

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int net_tcp_accept(NETSOCKET sock,NETSOCKET *new_sock,NETADDR *a)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  socklen_t sockaddr_len;
  sockaddr_in addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  new_sock->type = 0;
  new_sock->ipv4sock = -1;
  new_sock->ipv6sock = -1;
  if (-1 < sock._0_8_) {
    sockaddr_len = 0x10;
    iVar2 = accept(sock.ipv4sock,(sockaddr *)&addr,&sockaddr_len);
    if (iVar2 != -1) {
      sockaddr_to_netaddr((sockaddr *)&addr,a);
      new_sock->type = 1;
      new_sock->ipv4sock = iVar2;
      goto LAB_001c0880;
    }
  }
  iVar2 = -1;
  if (-1 < sock.ipv6sock) {
    sockaddr_len = 0x1c;
    iVar3 = accept(sock.ipv6sock,(sockaddr *)&addr,&sockaddr_len);
    if (iVar3 != -1) {
      sockaddr_to_netaddr((sockaddr *)&addr,a);
      new_sock->type = 2;
      new_sock->ipv6sock = iVar3;
      iVar2 = iVar3;
    }
  }
LAB_001c0880:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int net_tcp_accept(NETSOCKET sock, NETSOCKET *new_sock, NETADDR *a)
{
	int s;
	socklen_t sockaddr_len;

	*new_sock = invalid_socket;

	if(sock.ipv4sock >= 0)
	{
		struct sockaddr_in addr;
		sockaddr_len = sizeof(addr);

		s = accept(sock.ipv4sock, (struct sockaddr *)&addr, &sockaddr_len);

		if (s != -1)
		{
			sockaddr_to_netaddr((const struct sockaddr *)&addr, a);
			new_sock->type = NETTYPE_IPV4;
			new_sock->ipv4sock = s;
			return s;
		}
	}

	if(sock.ipv6sock >= 0)
	{
		struct sockaddr_in6 addr;
		sockaddr_len = sizeof(addr);

		s = accept(sock.ipv6sock, (struct sockaddr *)&addr, &sockaddr_len);

		if (s != -1)
		{
			sockaddr_to_netaddr((const struct sockaddr *)&addr, a);
			new_sock->type = NETTYPE_IPV6;
			new_sock->ipv6sock = s;
			return s;
		}
	}

	return -1;
}